

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O1

double icu_63::double_conversion::RadixStringToIeee<4,unsigned_short_const*>
                 (unsigned_short **current,unsigned_short *end,bool sign,bool allow_trailing_junk,
                 double junk_string_value,bool read_as_double,bool *result_is_junk)

{
  ushort uVar1;
  bool bVar2;
  unsigned_short *puVar3;
  ulong uVar4;
  double dVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  Double *this;
  ulong uVar11;
  sbyte sVar12;
  uint uVar13;
  Double *pDVar14;
  byte bVar15;
  ushort *puVar16;
  ushort *puVar17;
  bool bVar18;
  DiyFp diy_fp;
  
  *result_is_junk = true;
  puVar3 = *current;
  while (*puVar3 == 0x30) {
    puVar3 = puVar3 + 1;
    *current = puVar3;
    if (puVar3 == end) {
      *result_is_junk = false;
      if (sign) {
        return -0.0;
      }
      return 0.0;
    }
  }
  sVar12 = 0x18;
  if (read_as_double) {
    sVar12 = 0x35;
  }
  puVar17 = *current;
  uVar11 = 0;
  this = (Double *)0x0;
  do {
    uVar1 = *puVar17;
    uVar10 = (ulong)(uVar1 - 0x30);
    iVar7 = -0x30;
    if (uVar1 - 0x30 < 10) {
LAB_0025c46e:
      pDVar14 = (Double *)((long)this * 0x10 + (long)iVar7 + (ulong)uVar1);
      uVar4 = (long)pDVar14 >> sVar12;
      if ((int)uVar4 == 0) {
        puVar17 = puVar17 + 1;
        *current = puVar17;
        iVar7 = 0;
        this = pDVar14;
      }
      else {
        uVar11 = 1;
        if (1 < (int)uVar4) {
          uVar8 = uVar4 & 0xffffffff;
          do {
            uVar11 = (ulong)((int)uVar11 + 1);
            uVar8 = uVar8 >> 1;
            uVar9 = (uint)uVar4;
            uVar4 = uVar8;
          } while (3 < uVar9);
        }
        bVar6 = (byte)uVar11;
        this = (Double *)((long)pDVar14 >> (bVar6 & 0x3f));
        bVar15 = 1;
        puVar16 = puVar17;
        while( true ) {
          puVar17 = puVar16 + 1;
          if (puVar17 == end) break;
          uVar1 = *puVar17;
          uVar9 = uVar1 - 0x30;
          uVar10 = (ulong)CONCAT31((int3)(uVar9 >> 8),uVar9 < 10);
          if ((0x3f < uVar1 || uVar9 >= 10) &&
             ((0x25 < uVar1 - 0x41 || ((0x3f0000003fU >> ((ulong)(uVar1 - 0x41) & 0x3f) & 1) == 0)))
             ) break;
          bVar15 = bVar15 & uVar1 == 0x30;
          uVar11 = (ulong)((int)uVar11 + 4);
          puVar16 = puVar17;
        }
        *current = puVar17;
        if (!allow_trailing_junk) {
          bVar18 = puVar17 != end;
          if ((bVar18) && (bVar2 = isWhitespace((uint)*puVar17), uVar10 = extraout_RDX, bVar2)) {
            puVar16 = puVar16 + 2;
            do {
              puVar17 = puVar16;
              bVar18 = puVar17 != end;
              if (puVar17 == end) break;
              bVar2 = isWhitespace((uint)*puVar17);
              puVar16 = puVar17 + 1;
              uVar10 = extraout_RDX_00;
            } while (bVar2);
            *current = puVar17;
          }
          iVar7 = 1;
          if (bVar18) goto LAB_0025c672;
        }
        uVar13 = (uint)pDVar14 & ~(-1 << (bVar6 & 0x1f));
        uVar9 = 1 << (bVar6 - 1 & 0x1f);
        if ((int)uVar9 < (int)uVar13) {
          this = (Double *)((long)&this->d64_ + 1);
        }
        else if (uVar13 == uVar9) {
          this = (Double *)((long)&this->d64_ + (ulong)((byte)(~bVar15 | (byte)this) & 1));
        }
        bVar18 = ((ulong)this & 1L << sVar12) != 0;
        this = (Double *)((long)this >> bVar18);
        uVar11 = (ulong)((int)uVar11 + (uint)bVar18);
        iVar7 = 4;
      }
    }
    else {
      uVar10 = (ulong)(uVar1 - 0x61);
      iVar7 = -0x57;
      if ((ushort)(uVar1 - 0x61) < 6) goto LAB_0025c46e;
      uVar10 = (ulong)(uVar1 - 0x41);
      iVar7 = -0x37;
      if ((ushort)(uVar1 - 0x41) < 6) goto LAB_0025c46e;
      iVar7 = 4;
      if (!allow_trailing_junk) {
        bVar18 = puVar17 != end;
        if ((bVar18) && (bVar2 = isWhitespace((uint)*puVar17), uVar10 = extraout_RDX_01, bVar2)) {
          do {
            puVar17 = puVar17 + 1;
            bVar18 = puVar17 != end;
            if (puVar17 == end) break;
            bVar2 = isWhitespace((uint)*puVar17);
            uVar10 = extraout_RDX_02;
          } while (bVar2);
          *current = puVar17;
        }
        iVar7 = 4;
        if (bVar18) {
          iVar7 = 1;
        }
      }
    }
LAB_0025c672:
    if (iVar7 != 0) {
      if (iVar7 != 4) {
        return junk_string_value;
      }
      goto LAB_0025c6ba;
    }
    if (puVar17 == end) {
LAB_0025c6ba:
      *result_is_junk = false;
      if ((int)uVar11 != 0) {
        diy_fp._8_8_ = uVar10;
        diy_fp.f_ = uVar11;
        dVar5 = (double)Double::DiyFpToUint64(this,diy_fp);
        return dVar5;
      }
      if (sign) {
        if (this == (Double *)0x0) {
          return -0.0;
        }
        this = (Double *)-(long)this;
      }
      return (double)(long)this;
    }
  } while( true );
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  ASSERT(*current != end);

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  // Skip leading 0s.
  while (**current == '0') {
    ++(*current);
    if (*current == end) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);

  do {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent = overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        ++(*current);
        if (*current == end || !isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        exponent += radix_log_2;
      }

      if (!allow_trailing_junk && AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    ++(*current);
  } while (*current != end);

  ASSERT(number < ((int64_t)1 << kSignificandSize));
  ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (exponent == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  ASSERT(number != 0);
  return Double(DiyFp(number, exponent)).value();
}